

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O0

int nn_xbus_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_xbus_data *local_40;
  size_t local_38;
  size_t sz;
  nn_dist_data *pnStack_28;
  int rcvprio;
  nn_xbus_data *data;
  nn_xbus *xbus;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_40 = (nn_xbus_data *)self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_xbus_data *)0x0;
  }
  data = local_40;
  local_38 = 4;
  xbus = (nn_xbus *)pipe;
  pipe_local = (nn_pipe *)self;
  nn_pipe_getopt(pipe,0,9,(void *)((long)&sz + 4),&local_38);
  if (local_38 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvprio)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/bus/xbus.c"
            ,0x5f);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sz._4_4_ < 1 || 0x10 < sz._4_4_) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rcvprio >= 1 && rcvprio <= 16",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/bus/xbus.c"
            ,0x60);
    fflush(_stderr);
    nn_err_abort();
  }
  pnStack_28 = (nn_dist_data *)nn_alloc_(0x38);
  if (pnStack_28 == (nn_dist_data *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/bus/xbus.c"
            ,99);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fq_add((nn_fq *)&(data->initem).priodata.item,(nn_fq_data *)(pnStack_28 + 1),(nn_pipe *)xbus,
            sz._4_4_);
  nn_dist_add((nn_dist *)&(data->outitem).pipe,pnStack_28,(nn_pipe *)xbus);
  nn_pipe_setdata((nn_pipe *)xbus,pnStack_28);
  return 0;
}

Assistant:

int nn_xbus_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xbus *xbus;
    struct nn_xbus_data *data;
    int rcvprio;
    size_t sz;

    xbus = nn_cont (self, struct nn_xbus, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xbus_data), "pipe data (xbus)");
    alloc_assert (data);
    nn_fq_add (&xbus->inpipes, &data->initem, pipe, rcvprio);
    nn_dist_add (&xbus->outpipes, &data->outitem, pipe);
    nn_pipe_setdata (pipe, data);

    return 0;
}